

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O0

void bufchain_clear(bufchain *ch)

{
  bufchain_granule *b_00;
  bufchain_granule *b;
  bufchain *ch_local;
  
  while (ch->head != (bufchain_granule *)0x0) {
    b_00 = ch->head;
    ch->head = ch->head->next;
    smemclr(b_00,0x20);
    safefree(b_00);
  }
  ch->tail = (bufchain_granule *)0x0;
  ch->buffersize = 0;
  return;
}

Assistant:

void bufchain_clear(bufchain *ch)
{
    struct bufchain_granule *b;
    while (ch->head) {
        b = ch->head;
        ch->head = ch->head->next;
        smemclr(b, sizeof(*b));
        sfree(b);
    }
    ch->tail = NULL;
    ch->buffersize = 0;
}